

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O3

int stbiw__jpg_processDU
              (stbi__write_context *s,int *bitBuf,int *bitCnt,float *CDU,int du_stride,float *fdtbl,
              int DC,unsigned_short (*HTDC) [2],unsigned_short (*HTAC) [2])

{
  ushort uVar1;
  ushort uVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  unsigned_short *bs;
  long lVar9;
  long lVar10;
  long lVar11;
  uint uVar12;
  uint uVar13;
  long lVar14;
  float *d7p;
  uint uVar15;
  int iVar16;
  int DU [64];
  
  uVar1 = (*HTAC)[0];
  uVar2 = HTAC[0xf0][0];
  if (du_stride == 0) {
    lVar9 = 0;
  }
  else {
    lVar9 = (long)du_stride;
    d7p = CDU + 7;
    lVar14 = 0;
    do {
      stbiw__jpg_DCT(d7p + -7,d7p + -6,d7p + -5,d7p + -4,d7p + -3,d7p + -2,d7p + -1,d7p);
      lVar14 = lVar14 + lVar9;
      d7p = d7p + lVar9;
    } while (lVar14 < (long)(ulong)(uint)(du_stride * 8));
  }
  lVar14 = 0;
  do {
    stbiw__jpg_DCT((float *)((long)CDU + lVar14),(float *)((long)CDU + lVar14 + lVar9 * 4),
                   (float *)((long)CDU + lVar14 + (ulong)(uint)(du_stride * 2) * 4),
                   (float *)((long)CDU + lVar14 + (long)(du_stride * 3) * 4),
                   (float *)((long)CDU + lVar14 + (ulong)(uint)(du_stride * 4) * 4),
                   (float *)((long)CDU + lVar14 + (long)(du_stride * 5) * 4),
                   (float *)((long)CDU + lVar14 + (long)(du_stride * 6) * 4),
                   (float *)((long)CDU + lVar14 + (long)(du_stride * 7) * 4));
    lVar14 = lVar14 + 4;
  } while (lVar14 != 0x20);
  lVar14 = 0;
  lVar10 = 0;
  do {
    lVar10 = (long)(int)lVar10;
    lVar11 = 0;
    do {
      DU[""[lVar10 + lVar11]] =
           (int)(CDU[lVar11] * fdtbl[lVar10 + lVar11] +
                *(float *)(&DAT_001172e8 + (ulong)(CDU[lVar11] * fdtbl[lVar10 + lVar11] < 0.0) * 4))
      ;
      lVar11 = lVar11 + 1;
    } while (lVar11 != 8);
    lVar14 = lVar14 + 1;
    lVar10 = lVar10 + 8;
    CDU = CDU + lVar9;
  } while (lVar14 != 8);
  uVar5 = DU[0] - DC;
  if (uVar5 == 0) {
    bs = (unsigned_short *)(ulong)(*HTDC)[0];
  }
  else {
    uVar6 = -uVar5;
    if (0 < (int)uVar5) {
      uVar6 = uVar5;
    }
    uVar12 = 0x1f;
    if (uVar6 != 0) {
      for (; uVar6 >> uVar12 == 0; uVar12 = uVar12 - 1) {
      }
    }
    uVar13 = 1;
    if (1 < uVar6) {
      uVar13 = (uVar12 ^ 0xffffffe0) + 0x21;
    }
    stbiw__jpg_writeBits(s,bitBuf,bitCnt,(unsigned_short *)(ulong)HTDC[uVar13 & 0xff][0]);
    bs = (unsigned_short *)(ulong)(~(-1 << ((byte)uVar13 & 0x1f)) & ((int)uVar5 >> 0x1f) + uVar5);
  }
  stbiw__jpg_writeBits(s,bitBuf,bitCnt,bs);
  uVar8 = 0x40;
  while( true ) {
    iVar4 = (int)uVar8;
    uVar5 = iVar4 - 1;
    uVar8 = (ulong)uVar5;
    if (DU[uVar8] != 0) break;
    if (uVar5 < 2) goto LAB_00114374;
  }
  if ((int)uVar5 < 1) goto LAB_00114374;
  iVar7 = 1;
  do {
    lVar9 = (long)iVar7;
    uVar12 = 0xffffffff;
    uVar6 = 0;
    do {
      uVar15 = uVar6;
      uVar13 = DU[lVar9];
      uVar12 = uVar12 + 1;
      if ((long)uVar8 < lVar9) break;
      lVar9 = lVar9 + 1;
      uVar6 = uVar15 + 1;
    } while (uVar13 == 0);
    uVar6 = uVar12;
    if (0xf < (int)uVar12) {
      uVar15 = uVar15 >> 4;
      iVar16 = uVar15 + (uVar15 == 0);
      do {
        stbiw__jpg_writeBits(s,bitBuf,bitCnt,(unsigned_short *)(ulong)uVar2);
        iVar16 = iVar16 + -1;
      } while (iVar16 != 0);
      uVar6 = uVar12 & 0xf;
    }
    uVar15 = -uVar13;
    if (0 < (int)uVar13) {
      uVar15 = uVar13;
    }
    uVar3 = 0x1f;
    if (uVar15 != 0) {
      for (; uVar15 >> uVar3 == 0; uVar3 = uVar3 - 1) {
      }
    }
    uVar3 = (uVar3 ^ 0xffffffe0) + 0x21;
    if (uVar15 < 2) {
      uVar3 = 1;
    }
    iVar16 = iVar7 + uVar12;
    stbiw__jpg_writeBits
              (s,bitBuf,bitCnt,
               (unsigned_short *)(ulong)HTAC[(int)(uVar6 * 0x10 + (uVar3 & 0xff))][0]);
    stbiw__jpg_writeBits
              (s,bitBuf,bitCnt,
               (unsigned_short *)
               (ulong)(~(-1 << ((byte)uVar3 & 0x1f)) & ((int)uVar13 >> 0x1f) + uVar13));
    iVar7 = iVar7 + uVar12 + 1;
  } while (iVar16 < (int)uVar5);
  if (iVar4 != 0x40) {
LAB_00114374:
    stbiw__jpg_writeBits(s,bitBuf,bitCnt,(unsigned_short *)(ulong)uVar1);
  }
  return DU[0];
}

Assistant:

static int
stbiw__jpg_processDU(stbi__write_context *s, int *bitBuf, int *bitCnt, float *CDU, int du_stride, float *fdtbl, int DC,
                     const unsigned short HTDC[256][2], const unsigned short HTAC[256][2]) {
    const unsigned short EOB[2] = {HTAC[0x00][0], HTAC[0x00][1]};
    const unsigned short M16zeroes[2] = {HTAC[0xF0][0], HTAC[0xF0][1]};
    int dataOff, i, j, n, diff, end0pos, x, y;
    int DU[64];

    // DCT rows
    for (dataOff = 0, n = du_stride * 8; dataOff < n; dataOff += du_stride) {
        stbiw__jpg_DCT(&CDU[dataOff], &CDU[dataOff + 1], &CDU[dataOff + 2], &CDU[dataOff + 3], &CDU[dataOff + 4],
                       &CDU[dataOff + 5], &CDU[dataOff + 6], &CDU[dataOff + 7]);
    }
    // DCT columns
    for (dataOff = 0; dataOff < 8; ++dataOff) {
        stbiw__jpg_DCT(&CDU[dataOff], &CDU[dataOff + du_stride], &CDU[dataOff + du_stride * 2],
                       &CDU[dataOff + du_stride * 3], &CDU[dataOff + du_stride * 4],
                       &CDU[dataOff + du_stride * 5], &CDU[dataOff + du_stride * 6], &CDU[dataOff + du_stride * 7]);
    }
    // Quantize/descale/zigzag the coefficients
    for (y = 0, j = 0; y < 8; ++y) {
        for (x = 0; x < 8; ++x, ++j) {
            float v;
            i = y * du_stride + x;
            v = CDU[i] * fdtbl[j];
            // DU[stbiw__jpg_ZigZag[j]] = (int)(v < 0 ? ceilf(v - 0.5f) : floorf(v + 0.5f));
            // ceilf() and floorf() are C99, not C89, but I /think/ they're not needed here anyway?
            DU[stbiw__jpg_ZigZag[j]] = (int) (v < 0 ? v - 0.5f : v + 0.5f);
        }
    }

    // Encode DC
    diff = DU[0] - DC;
    if (diff == 0) {
        stbiw__jpg_writeBits(s, bitBuf, bitCnt, HTDC[0]);
    } else {
        unsigned short bits[2];
        stbiw__jpg_calcBits(diff, bits);
        stbiw__jpg_writeBits(s, bitBuf, bitCnt, HTDC[bits[1]]);
        stbiw__jpg_writeBits(s, bitBuf, bitCnt, bits);
    }
    // Encode ACs
    end0pos = 63;
    for (; (end0pos > 0) && (DU[end0pos] == 0); --end0pos) {
    }
    // end0pos = first element in reverse order !=0
    if (end0pos == 0) {
        stbiw__jpg_writeBits(s, bitBuf, bitCnt, EOB);
        return DU[0];
    }
    for (i = 1; i <= end0pos; ++i) {
        int startpos = i;
        int nrzeroes;
        unsigned short bits[2];
        for (; DU[i] == 0 && i <= end0pos; ++i) {
        }
        nrzeroes = i - startpos;
        if (nrzeroes >= 16) {
            int lng = nrzeroes >> 4;
            int nrmarker;
            for (nrmarker = 1; nrmarker <= lng; ++nrmarker)
                stbiw__jpg_writeBits(s, bitBuf, bitCnt, M16zeroes);
            nrzeroes &= 15;
        }
        stbiw__jpg_calcBits(DU[i], bits);
        stbiw__jpg_writeBits(s, bitBuf, bitCnt, HTAC[(nrzeroes << 4) + bits[1]]);
        stbiw__jpg_writeBits(s, bitBuf, bitCnt, bits);
    }
    if (end0pos != 63) {
        stbiw__jpg_writeBits(s, bitBuf, bitCnt, EOB);
    }
    return DU[0];
}